

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::ModifyTests::ModifyTests
          (ModifyTests *this,EglTestContext *eglTestCtx,string *name,string *desc)

{
  long lVar1;
  
  ImageTests::ImageTests(&this->super_ImageTests,eglTestCtx,name,desc);
  (this->super_ImageTests).super_TestCaseGroup.super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ModifyTests_003f3160;
  lVar1 = 0;
  do {
    *(char **)((long)&(this->m_modifyActions).m_actions[0].label._M_dataplus._M_p + lVar1) =
         (this->m_modifyActions).m_actions[0].label.field_2._M_local_buf + lVar1;
    *(undefined8 *)((long)&(this->m_modifyActions).m_actions[0].label._M_string_length + lVar1) = 0;
    (this->m_modifyActions).m_actions[0].label.field_2._M_local_buf[lVar1] = '\0';
    *(undefined8 *)
     ((long)&(this->m_modifyActions).m_actions[0].action.
             super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
             .m_data.ptr + lVar1) = 0;
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0x600);
  (this->m_modifyActions).m_numActions = 0;
  (this->m_renderAction).super_Render.super_GLES2Action.super_Action._vptr_Action =
       (_func_int **)&PTR__Action_003f3070;
  return;
}

Assistant:

ModifyTests		(EglTestContext& eglTestCtx, const string& name, const string& desc)
									: ImageTests(eglTestCtx, name, desc) {}